

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::GetTileSize
          (DeviceContextVkImpl *this,Uint32 *TileSizeX,Uint32 *TileSizeY)

{
  PFN_vkGetRenderAreaGranularity p_Var1;
  RenderDeviceVkImpl *this_00;
  VkDevice pVVar2;
  VkExtent2D local_30;
  VkExtent2D Granularity;
  VulkanLogicalDevice *LogicalDevice;
  Uint32 *TileSizeY_local;
  Uint32 *TileSizeX_local;
  DeviceContextVkImpl *this_local;
  
  *TileSizeX = 0;
  *TileSizeY = 0;
  if (this->m_vkRenderPass != (VkRenderPass)0x0) {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
    Granularity = (VkExtent2D)RenderDeviceVkImpl::GetLogicalDevice(this_00);
    memset(&local_30,0,8);
    p_Var1 = vkGetRenderAreaGranularity;
    pVVar2 = VulkanUtilities::VulkanLogicalDevice::GetVkDevice((VulkanLogicalDevice *)Granularity);
    (*p_Var1)(pVVar2,this->m_vkRenderPass,&local_30);
    *TileSizeX = local_30.width;
    *TileSizeY = local_30.height;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::GetTileSize(Uint32& TileSizeX, Uint32& TileSizeY)
{
    TileSizeX = 0;
    TileSizeY = 0;

    if (m_vkRenderPass != VK_NULL_HANDLE)
    {
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
        VkExtent2D                                  Granularity   = {};
        vkGetRenderAreaGranularity(LogicalDevice.GetVkDevice(), m_vkRenderPass, &Granularity);

        TileSizeX = Granularity.width;
        TileSizeY = Granularity.height;
    }
}